

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_ssse3.c
# Opt level: O3

void av1_dist_wtd_convolve_2d_ssse3
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  CONV_BUF_TYPE *pCVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [31];
  undefined1 auVar20 [31];
  undefined1 auVar21 [31];
  undefined1 auVar22 [31];
  undefined1 auVar23 [31];
  undefined1 auVar24 [31];
  undefined1 auVar25 [31];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  uint uVar40;
  CONV_BUF_TYPE *pCVar41;
  undefined1 *puVar42;
  uint8_t *puVar43;
  char cVar44;
  int iVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  int iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [15];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  CONV_BUF_TYPE CVar59;
  CONV_BUF_TYPE CVar67;
  CONV_BUF_TYPE CVar68;
  CONV_BUF_TYPE CVar69;
  CONV_BUF_TYPE CVar70;
  CONV_BUF_TYPE CVar71;
  CONV_BUF_TYPE CVar72;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  CONV_BUF_TYPE CVar73;
  undefined4 uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined4 local_8b78;
  short local_8b58;
  short sStack_8b56;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar90 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [16];
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  
  uVar10 = conv_params->round_0;
  uVar11 = conv_params->round_1;
  cVar44 = (char)(uVar11 + uVar10);
  uVar40 = 0xe - (uVar11 + uVar10);
  uVar7 = filter_params_y->taps;
  uVar47 = (h + (uint)uVar7) - 1;
  if (0 < (int)uVar47) {
    iVar45 = ((1 << ((byte)uVar10 & 0x1f)) >> 1) + 0x4000;
    auVar50 = ZEXT416((uint)uVar10);
    piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
    uVar74 = *(undefined4 *)piVar1;
    uVar33 = *(undefined4 *)(piVar1 + 2);
    uVar34 = *(undefined4 *)(piVar1 + 4);
    uVar35 = *(undefined4 *)(piVar1 + 6);
    auVar54._4_4_ = uVar74;
    auVar54._0_4_ = uVar74;
    auVar54._8_4_ = uVar74;
    auVar54._12_4_ = uVar74;
    auVar57._4_4_ = uVar35;
    auVar57._0_4_ = uVar35;
    auVar57._8_4_ = uVar35;
    auVar57._12_4_ = uVar35;
    puVar43 = src + (1 - ((long)(int)(((uVar7 >> 1) - 1) * src_stride) +
                         (ulong)(filter_params_x->taps >> 1)));
    puVar42 = local_8b38;
    uVar46 = 0;
    do {
      if (0 < w) {
        lVar48 = 0;
        do {
          auVar75 = *(undefined1 (*) [16])(puVar43 + lVar48);
          auVar26[0xd] = 0;
          auVar26._0_13_ = auVar75._0_13_;
          auVar26[0xe] = auVar75[7];
          auVar27[0xc] = auVar75[6];
          auVar27._0_12_ = auVar75._0_12_;
          auVar27._13_2_ = auVar26._13_2_;
          auVar28[0xb] = 0;
          auVar28._0_11_ = auVar75._0_11_;
          auVar28._12_3_ = auVar27._12_3_;
          auVar29[10] = auVar75[5];
          auVar29._0_10_ = auVar75._0_10_;
          auVar29._11_4_ = auVar28._11_4_;
          auVar30[9] = 0;
          auVar30._0_9_ = auVar75._0_9_;
          auVar30._10_5_ = auVar29._10_5_;
          auVar31[8] = auVar75[4];
          auVar31._0_8_ = auVar75._0_8_;
          auVar31._9_6_ = auVar30._9_6_;
          auVar37._7_8_ = 0;
          auVar37._0_7_ = auVar31._8_7_;
          auVar38._1_8_ = SUB158(auVar37 << 0x40,7);
          auVar38[0] = auVar75[3];
          auVar38._9_6_ = 0;
          auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
          auVar39[0] = auVar75[2];
          auVar39._11_4_ = 0;
          auVar32[2] = auVar75[1];
          auVar32._0_2_ = auVar75._0_2_;
          auVar32._3_12_ = SUB1512(auVar39 << 0x20,3);
          auVar65._0_2_ = auVar75._0_2_ & 0xff;
          auVar65._2_13_ = auVar32._2_13_;
          auVar65[0xf] = 0;
          auVar56[1] = 0;
          auVar56[0] = auVar75[8];
          auVar56[2] = auVar75[9];
          auVar56[3] = 0;
          auVar56[4] = auVar75[10];
          auVar56[5] = 0;
          auVar56[6] = auVar75[0xb];
          auVar56[7] = 0;
          auVar56[8] = auVar75[0xc];
          auVar56[9] = 0;
          auVar56[10] = auVar75[0xd];
          auVar56[0xb] = 0;
          auVar56[0xc] = auVar75[0xe];
          auVar56[0xd] = 0;
          auVar56[0xe] = auVar75[0xf];
          auVar19._16_15_ = auVar56;
          auVar19._0_16_ = auVar65;
          auVar20._16_15_ = auVar56;
          auVar20._0_16_ = auVar65;
          auVar83._4_4_ = uVar34;
          auVar83._0_4_ = uVar34;
          auVar83._8_4_ = uVar34;
          auVar83._12_4_ = uVar34;
          auVar83 = pmaddwd(auVar20._8_16_,auVar83);
          auVar21._16_15_ = auVar56;
          auVar21._0_16_ = auVar65;
          auVar98 = pmaddwd(auVar21._12_16_,auVar57);
          auVar22._16_15_ = auVar56;
          auVar22._0_16_ = auVar65;
          auVar23._16_15_ = auVar56;
          auVar23._0_16_ = auVar65;
          auVar24._16_15_ = auVar56;
          auVar24._0_16_ = auVar65;
          auVar25._16_15_ = auVar56;
          auVar25._0_16_ = auVar65;
          auVar60 = pmaddwd(auVar65,auVar54);
          auVar75._4_4_ = uVar33;
          auVar75._0_4_ = uVar33;
          auVar75._8_4_ = uVar33;
          auVar75._12_4_ = uVar33;
          auVar75 = pmaddwd(auVar19._4_16_,auVar75);
          auVar88._0_4_ =
               auVar60._0_4_ + iVar45 + auVar75._0_4_ + auVar98._0_4_ + auVar83._0_4_ >> auVar50;
          auVar88._4_4_ =
               auVar60._4_4_ + iVar45 + auVar75._4_4_ + auVar98._4_4_ + auVar83._4_4_ >> auVar50;
          auVar88._8_4_ =
               auVar60._8_4_ + iVar45 + auVar75._8_4_ + auVar98._8_4_ + auVar83._8_4_ >> auVar50;
          auVar88._12_4_ =
               auVar60._12_4_ + iVar45 + auVar75._12_4_ + auVar98._12_4_ + auVar83._12_4_ >> auVar50
          ;
          auVar83 = pmaddwd(auVar22._2_16_,auVar54);
          auVar60._4_4_ = uVar33;
          auVar60._0_4_ = uVar33;
          auVar60._8_4_ = uVar33;
          auVar60._12_4_ = uVar33;
          auVar60 = pmaddwd(auVar23._6_16_,auVar60);
          auVar98._4_4_ = uVar34;
          auVar98._0_4_ = uVar34;
          auVar98._8_4_ = uVar34;
          auVar98._12_4_ = uVar34;
          auVar98 = pmaddwd(auVar24._10_16_,auVar98);
          auVar75 = pmaddwd(auVar25._14_16_,auVar57);
          auVar93._0_4_ =
               auVar83._0_4_ + iVar45 + auVar98._0_4_ + auVar60._0_4_ + auVar75._0_4_ >> auVar50;
          auVar93._4_4_ =
               auVar83._4_4_ + iVar45 + auVar98._4_4_ + auVar60._4_4_ + auVar75._4_4_ >> auVar50;
          auVar93._8_4_ =
               auVar83._8_4_ + iVar45 + auVar98._8_4_ + auVar60._8_4_ + auVar75._8_4_ >> auVar50;
          auVar93._12_4_ =
               auVar83._12_4_ + iVar45 + auVar98._12_4_ + auVar60._12_4_ + auVar75._12_4_ >> auVar50
          ;
          auVar75 = packssdw(auVar88,auVar93);
          *(undefined1 (*) [16])(puVar42 + lVar48 * 2) = auVar75;
          lVar48 = lVar48 + 8;
        } while (lVar48 < w);
      }
      uVar46 = uVar46 + 1;
      puVar43 = puVar43 + src_stride;
      puVar42 = puVar42 + 0x100;
    } while (uVar46 != uVar47);
  }
  local_8b78 = (uint)uVar7;
  if (0 < h) {
    uVar47 = (1 << (0x16U - cVar44 & 0x1f)) + (1 << (0x15U - cVar44 & 0x1f));
    uVar53 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
    auVar54 = pshuflw(ZEXT416(uVar47),ZEXT416(uVar47),0);
    pCVar41 = conv_params->dst;
    iVar45 = conv_params->dst_stride;
    iVar8 = conv_params->do_average;
    iVar9 = conv_params->use_dist_wtd_comp_avg;
    iVar49 = ((1 << ((byte)uVar11 & 0x1f)) >> 1) + (-1 << (0x15 - (byte)uVar10 & 0x1f));
    auVar50 = ZEXT416((uint)uVar11);
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * local_8b78;
    uVar74 = *(undefined4 *)piVar1;
    uVar33 = *(undefined4 *)(piVar1 + 2);
    uVar34 = *(undefined4 *)(piVar1 + 4);
    uVar35 = *(undefined4 *)(piVar1 + 6);
    auVar52._4_4_ = uVar74;
    auVar52._0_4_ = uVar74;
    auVar52._8_4_ = uVar74;
    auVar52._12_4_ = uVar74;
    auVar55._4_4_ = uVar35;
    auVar55._0_4_ = uVar35;
    auVar55._8_4_ = uVar35;
    auVar55._12_4_ = uVar35;
    auVar57 = ZEXT416(((uint)(1 << ((byte)uVar40 & 0x1f)) >> 1) - uVar47);
    auVar57 = pshuflw(auVar57,auVar57,0);
    puVar42 = local_8438;
    uVar46 = 0;
    do {
      if (0 < w) {
        lVar48 = 0;
        do {
          auVar75 = *(undefined1 (*) [16])(puVar42 + lVar48 * 2 + -0x700);
          puVar4 = (undefined2 *)(puVar42 + lVar48 * 2 + -0x600);
          auVar60 = *(undefined1 (*) [16])(puVar42 + lVar48 * 2 + -0x500);
          auVar87._0_12_ = auVar75._0_12_;
          auVar87._12_2_ = auVar75._6_2_;
          auVar87._14_2_ = puVar4[3];
          auVar86._12_4_ = auVar87._12_4_;
          auVar86._0_10_ = auVar75._0_10_;
          auVar86._10_2_ = puVar4[2];
          auVar85._10_6_ = auVar86._10_6_;
          auVar85._0_8_ = auVar75._0_8_;
          auVar85._8_2_ = auVar75._4_2_;
          auVar84._8_8_ = auVar85._8_8_;
          auVar84._6_2_ = puVar4[1];
          auVar84._4_2_ = auVar75._2_2_;
          auVar84._0_2_ = auVar75._0_2_;
          auVar84._2_2_ = *puVar4;
          puVar5 = (undefined2 *)(puVar42 + lVar48 * 2 + -0x400);
          auVar64._0_12_ = auVar60._0_12_;
          auVar64._12_2_ = auVar60._6_2_;
          auVar64._14_2_ = puVar5[3];
          auVar63._12_4_ = auVar64._12_4_;
          auVar63._0_10_ = auVar60._0_10_;
          auVar63._10_2_ = puVar5[2];
          auVar62._10_6_ = auVar63._10_6_;
          auVar62._0_8_ = auVar60._0_8_;
          auVar62._8_2_ = auVar60._4_2_;
          auVar61._8_8_ = auVar62._8_8_;
          auVar61._6_2_ = puVar5[1];
          auVar61._4_2_ = auVar60._2_2_;
          auVar61._0_2_ = auVar60._0_2_;
          auVar61._2_2_ = *puVar5;
          auVar83 = *(undefined1 (*) [16])(puVar42 + lVar48 * 2 + -0x300);
          puVar6 = (undefined2 *)(puVar42 + lVar48 * 2 + -0x200);
          auVar103._0_12_ = auVar83._0_12_;
          auVar103._12_2_ = auVar83._6_2_;
          auVar103._14_2_ = puVar6[3];
          auVar102._12_4_ = auVar103._12_4_;
          auVar102._0_10_ = auVar83._0_10_;
          auVar102._10_2_ = puVar6[2];
          auVar101._10_6_ = auVar102._10_6_;
          auVar101._0_8_ = auVar83._0_8_;
          auVar101._8_2_ = auVar83._4_2_;
          auVar100._8_8_ = auVar101._8_8_;
          auVar100._6_2_ = puVar6[1];
          auVar100._4_2_ = auVar83._2_2_;
          auVar100._0_2_ = auVar83._0_2_;
          auVar100._2_2_ = *puVar6;
          auVar98 = *(undefined1 (*) [16])(puVar42 + lVar48 * 2 + -0x100);
          puVar2 = (undefined2 *)(puVar42 + lVar48 * 2);
          auVar88 = pmaddwd(auVar84,auVar52);
          auVar104._4_4_ = uVar33;
          auVar104._0_4_ = uVar33;
          auVar104._8_4_ = uVar33;
          auVar104._12_4_ = uVar33;
          auVar65 = pmaddwd(auVar61,auVar104);
          auVar92._0_12_ = auVar98._0_12_;
          auVar92._12_2_ = auVar98._6_2_;
          auVar92._14_2_ = puVar2[3];
          auVar91._12_4_ = auVar92._12_4_;
          auVar91._0_10_ = auVar98._0_10_;
          auVar91._10_2_ = puVar2[2];
          auVar90._10_6_ = auVar91._10_6_;
          auVar90._0_8_ = auVar98._0_8_;
          auVar90._8_2_ = auVar98._4_2_;
          auVar89._8_8_ = auVar90._8_8_;
          auVar89._6_2_ = puVar2[1];
          auVar89._4_2_ = auVar98._2_2_;
          auVar89._0_2_ = auVar98._0_2_;
          auVar89._2_2_ = *puVar2;
          auVar17._4_4_ = uVar34;
          auVar17._0_4_ = uVar34;
          auVar17._8_4_ = uVar34;
          auVar17._12_4_ = uVar34;
          auVar104 = pmaddwd(auVar100,auVar17);
          auVar93 = pmaddwd(auVar89,auVar55);
          auVar99._2_2_ = puVar4[4];
          auVar99._0_2_ = auVar75._8_2_;
          auVar99._4_2_ = auVar75._10_2_;
          auVar99._6_2_ = puVar4[5];
          auVar99._8_2_ = auVar75._12_2_;
          auVar99._10_2_ = puVar4[6];
          auVar99._12_2_ = auVar75._14_2_;
          auVar99._14_2_ = puVar4[7];
          auVar58._2_2_ = puVar5[4];
          auVar58._0_2_ = auVar60._8_2_;
          auVar58._4_2_ = auVar60._10_2_;
          auVar58._6_2_ = puVar5[5];
          auVar58._8_2_ = auVar60._12_2_;
          auVar58._10_2_ = puVar5[6];
          auVar58._12_2_ = auVar60._14_2_;
          auVar58._14_2_ = puVar5[7];
          auVar51._2_2_ = puVar6[4];
          auVar51._0_2_ = auVar83._8_2_;
          auVar51._4_2_ = auVar83._10_2_;
          auVar51._6_2_ = puVar6[5];
          auVar51._8_2_ = auVar83._12_2_;
          auVar51._10_2_ = puVar6[6];
          auVar51._12_2_ = auVar83._14_2_;
          auVar51._14_2_ = puVar6[7];
          auVar76._2_2_ = puVar2[4];
          auVar76._0_2_ = auVar98._8_2_;
          auVar76._4_2_ = auVar98._10_2_;
          auVar76._6_2_ = puVar2[5];
          auVar76._8_2_ = auVar98._12_2_;
          auVar76._10_2_ = puVar2[6];
          auVar76._12_2_ = auVar98._14_2_;
          auVar76._14_2_ = puVar2[7];
          auVar98 = pmaddwd(auVar99,auVar52);
          auVar16._4_4_ = uVar33;
          auVar16._0_4_ = uVar33;
          auVar16._8_4_ = uVar33;
          auVar16._12_4_ = uVar33;
          auVar60 = pmaddwd(auVar58,auVar16);
          auVar18._4_4_ = uVar34;
          auVar18._0_4_ = uVar34;
          auVar18._8_4_ = uVar34;
          auVar18._12_4_ = uVar34;
          auVar75 = pmaddwd(auVar51,auVar18);
          auVar83 = pmaddwd(auVar76,auVar55);
          auVar66._0_4_ =
               auVar93._0_4_ + auVar104._0_4_ + auVar65._0_4_ + auVar88._0_4_ + iVar49 >> auVar50;
          auVar66._4_4_ =
               auVar83._0_4_ + auVar75._0_4_ + auVar60._0_4_ + auVar98._0_4_ + iVar49 >> auVar50;
          auVar66._8_4_ =
               auVar93._4_4_ + auVar104._4_4_ + auVar65._4_4_ + auVar88._4_4_ + iVar49 >> auVar50;
          auVar66._12_4_ =
               auVar83._4_4_ + auVar75._4_4_ + auVar60._4_4_ + auVar98._4_4_ + iVar49 >> auVar50;
          auVar94._0_4_ =
               auVar93._8_4_ + auVar104._8_4_ + auVar65._8_4_ + auVar88._8_4_ + iVar49 >> auVar50;
          auVar94._4_4_ =
               auVar83._8_4_ + auVar75._8_4_ + auVar60._8_4_ + auVar98._8_4_ + iVar49 >> auVar50;
          auVar94._8_4_ =
               auVar93._12_4_ + auVar104._12_4_ + auVar65._12_4_ + auVar88._12_4_ + iVar49 >>
               auVar50;
          auVar94._12_4_ =
               auVar83._12_4_ + auVar75._12_4_ + auVar60._12_4_ + auVar98._12_4_ + iVar49 >> auVar50
          ;
          auVar75 = packssdw(auVar66,auVar94);
          local_8b58 = auVar54._0_2_;
          sStack_8b56 = auVar54._2_2_;
          CVar59 = auVar75._0_2_ + local_8b58;
          CVar67 = auVar75._2_2_ + sStack_8b56;
          CVar68 = auVar75._4_2_ + local_8b58;
          CVar69 = auVar75._6_2_ + sStack_8b56;
          CVar70 = auVar75._8_2_ + local_8b58;
          CVar71 = auVar75._10_2_ + sStack_8b56;
          CVar72 = auVar75._12_2_ + local_8b58;
          CVar73 = auVar75._14_2_ + sStack_8b56;
          if (iVar8 == 0) {
            pCVar3 = pCVar41 + lVar48;
            *pCVar3 = CVar59;
            pCVar3[1] = CVar67;
            pCVar3[2] = CVar68;
            pCVar3[3] = CVar69;
            pCVar3[4] = CVar70;
            pCVar3[5] = CVar71;
            pCVar3[6] = CVar72;
            pCVar3[7] = CVar73;
          }
          else {
            auVar75 = *(undefined1 (*) [16])(pCVar41 + lVar48);
            if (iVar9 == 0) {
              auVar97._0_2_ = auVar75._0_2_ + CVar59;
              auVar97._2_2_ = auVar75._2_2_ + CVar67;
              auVar97._4_2_ = auVar75._4_2_ + CVar68;
              auVar97._6_2_ = auVar75._6_2_ + CVar69;
              auVar97._8_2_ = auVar75._8_2_ + CVar70;
              auVar97._10_2_ = auVar75._10_2_ + CVar71;
              auVar97._12_2_ = auVar75._12_2_ + CVar72;
              auVar97._14_2_ = auVar75._14_2_ + CVar73;
              auVar75 = psraw(auVar97,1);
            }
            else {
              auVar80._0_12_ = auVar75._0_12_;
              auVar80._12_2_ = auVar75._6_2_;
              auVar80._14_2_ = CVar69;
              auVar79._12_4_ = auVar80._12_4_;
              auVar79._0_10_ = auVar75._0_10_;
              auVar79._10_2_ = CVar68;
              auVar78._10_6_ = auVar79._10_6_;
              auVar78._0_8_ = auVar75._0_8_;
              auVar78._8_2_ = auVar75._4_2_;
              auVar77._8_8_ = auVar78._8_8_;
              auVar77._6_2_ = CVar67;
              auVar77._4_2_ = auVar75._2_2_;
              auVar77._2_2_ = CVar59;
              auVar77._0_2_ = auVar75._0_2_;
              auVar95._2_2_ = CVar70;
              auVar95._0_2_ = auVar75._8_2_;
              auVar95._4_2_ = auVar75._10_2_;
              auVar95._6_2_ = CVar71;
              auVar95._8_2_ = auVar75._12_2_;
              auVar95._10_2_ = CVar72;
              auVar95._12_2_ = auVar75._14_2_;
              auVar95._14_2_ = CVar73;
              auVar36._4_4_ = uVar53;
              auVar36._0_4_ = uVar53;
              auVar36._8_4_ = uVar53;
              auVar36._12_4_ = uVar53;
              auVar75 = pmaddwd(auVar77,auVar36);
              auVar60 = pmaddwd(auVar95,auVar36);
              auVar81._0_4_ = auVar75._0_4_ >> 4;
              auVar81._4_4_ = auVar75._4_4_ >> 4;
              auVar81._8_4_ = auVar75._8_4_ >> 4;
              auVar81._12_4_ = auVar75._12_4_ >> 4;
              auVar96._0_4_ = auVar60._0_4_ >> 4;
              auVar96._4_4_ = auVar60._4_4_ >> 4;
              auVar96._8_4_ = auVar60._8_4_ >> 4;
              auVar96._12_4_ = auVar60._12_4_ >> 4;
              auVar75 = packssdw(auVar81,auVar96);
            }
            local_8b78._0_2_ = auVar57._0_2_;
            local_8b78._2_2_ = auVar57._2_2_;
            auVar82._0_2_ = auVar75._0_2_ + (short)local_8b78;
            auVar82._2_2_ = auVar75._2_2_ + local_8b78._2_2_;
            auVar82._4_2_ = auVar75._4_2_ + (short)local_8b78;
            auVar82._6_2_ = auVar75._6_2_ + local_8b78._2_2_;
            auVar82._8_2_ = auVar75._8_2_ + (short)local_8b78;
            auVar82._10_2_ = auVar75._10_2_ + local_8b78._2_2_;
            auVar82._12_2_ = auVar75._12_2_ + (short)local_8b78;
            auVar82._14_2_ = auVar75._14_2_ + local_8b78._2_2_;
            auVar75 = psraw(auVar82,ZEXT416(uVar40));
            sVar12 = auVar75._0_2_;
            sVar13 = auVar75._2_2_;
            sVar14 = auVar75._4_2_;
            sVar15 = auVar75._6_2_;
            uVar74 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar75[6] - (0xff < sVar15),
                              CONCAT12((0 < sVar14) * (sVar14 < 0x100) * auVar75[4] -
                                       (0xff < sVar14),
                                       CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar75[2] -
                                                (0xff < sVar13),
                                                (0 < sVar12) * (sVar12 < 0x100) * auVar75[0] -
                                                (0xff < sVar12))));
            sVar12 = auVar75._8_2_;
            sVar13 = auVar75._10_2_;
            sVar14 = auVar75._12_2_;
            sVar15 = auVar75._14_2_;
            if (w < 5) {
              *(undefined4 *)(dst0 + lVar48) = uVar74;
            }
            else {
              *(ulong *)(dst0 + lVar48) =
                   CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar75[0xe] - (0xff < sVar15),
                            CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar75[0xc] -
                                     (0xff < sVar14),
                                     CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar75[10] -
                                              (0xff < sVar13),
                                              CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar75[8]
                                                       - (0xff < sVar12),uVar74))));
            }
          }
          lVar48 = lVar48 + 8;
        } while (lVar48 < w);
      }
      uVar46 = uVar46 + 1;
      pCVar41 = pCVar41 + iVar45;
      dst0 = dst0 + dst_stride0;
      puVar42 = puVar42 + 0x100;
    } while (uVar46 != (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_ssse3(
    const uint8_t *src, int src_stride, uint8_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const __m128i zero = _mm_setzero_si128();

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

        const __m128i src_lo = _mm_unpacklo_epi8(data, zero);
        const __m128i src_hi = _mm_unpackhi_epi8(data, zero);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(src_lo, coeff_01);
        const __m128i src_2 = _mm_alignr_epi8(src_hi, src_lo, 4);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i src_4 = _mm_alignr_epi8(src_hi, src_lo, 8);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i src_6 = _mm_alignr_epi8(src_hi, src_lo, 12);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_alignr_epi8(src_hi, src_lo, 2);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i src_3 = _mm_alignr_epi8(src_hi, src_lo, 6);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i src_5 = _mm_alignr_epi8(src_hi, src_lo, 10);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i src_7 = _mm_alignr_epi8(src_hi, src_lo, 14);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_store_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
        const __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

        const __m128i res_16b = _mm_packs_epi32(res_lo_round, res_hi_round);
        const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);

          if (w > 4)
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
          else
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
      }
    }
  }
}